

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeFunctionSet * __thiscall
ExpressionContext::GetFunctionSetType(ExpressionContext *this,ArrayView<TypeBase_*> setTypes)

{
  uint uVar1;
  TypeBase *pTVar2;
  IntrusiveList<TypeHandle> types;
  IntrusiveList<TypeHandle> types_00;
  uint uVar3;
  uint uVar4;
  TypeBase **ppTVar5;
  TypeHandle *this_00;
  TypeFunctionSet *pTVar6;
  InplaceStr name;
  TypeFunctionSet *local_68;
  TypeFunctionSet *result;
  undefined1 auStack_58 [4];
  uint i_2;
  IntrusiveList<TypeHandle> setTypeList;
  uint i_1;
  bool match;
  TypeHandle *leftArg;
  TypeFunctionSet *type;
  uint e;
  uint i;
  ExpressionContext *this_local;
  ArrayView<TypeBase_*> setTypes_local;
  
  this_local = (ExpressionContext *)setTypes.data;
  setTypes_local.data._0_4_ = setTypes.count;
  type._4_4_ = 0;
  uVar1 = (this->functionSetTypes).count;
  do {
    if (uVar1 <= type._4_4_) {
      IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)auStack_58);
      for (result._4_4_ = 0; uVar1 = result._4_4_,
          uVar4 = ArrayView<TypeBase_*>::size((ArrayView<TypeBase_*> *)&this_local), uVar1 < uVar4;
          result._4_4_ = result._4_4_ + 1) {
        this_00 = get<TypeHandle>(this);
        ppTVar5 = ArrayView<TypeBase_*>::operator[]
                            ((ArrayView<TypeBase_*> *)&this_local,result._4_4_);
        TypeHandle::TypeHandle(this_00,*ppTVar5);
        IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)auStack_58,this_00);
      }
      pTVar6 = get<TypeFunctionSet>(this);
      types_00.tail = setTypeList.head;
      types_00.head = _auStack_58;
      name = GetFunctionSetTypeName(this,types_00);
      types.tail = setTypeList.head;
      types.head = _auStack_58;
      TypeFunctionSet::TypeFunctionSet(pTVar6,name,types);
      local_68 = pTVar6;
      SmallArray<TypeFunctionSet_*,_128U>::push_back(&this->functionSetTypes,&local_68);
      return local_68;
    }
    pTVar6 = (this->functionSetTypes).data[type._4_4_];
    if (pTVar6 != (TypeFunctionSet *)0x0) {
      _i_1 = (pTVar6->types).head;
      setTypeList.tail._7_1_ = 1;
      for (setTypeList.tail._0_4_ = 0; uVar4 = (uint)setTypeList.tail,
          uVar3 = ArrayView<TypeBase_*>::size((ArrayView<TypeBase_*> *)&this_local), uVar4 < uVar3;
          setTypeList.tail._0_4_ = (uint)setTypeList.tail + 1) {
        if ((_i_1 == (TypeHandle *)0x0) ||
           (pTVar2 = _i_1->type,
           ppTVar5 = ArrayView<TypeBase_*>::operator[]
                               ((ArrayView<TypeBase_*> *)&this_local,(uint)setTypeList.tail),
           pTVar2 != *ppTVar5)) {
          setTypeList.tail._7_1_ = 0;
          break;
        }
        _i_1 = _i_1->next;
      }
      if (((setTypeList.tail._7_1_ & 1) != 0) && (_i_1 == (TypeHandle *)0x0)) {
        return pTVar6;
      }
    }
    type._4_4_ = type._4_4_ + 1;
  } while( true );
}

Assistant:

TypeFunctionSet* ExpressionContext::GetFunctionSetType(ArrayView<TypeBase*> setTypes)
{
	for(unsigned i = 0, e = functionSetTypes.count; i < e; i++)
	{
		if(TypeFunctionSet *type = functionSetTypes.data[i])
		{
			TypeHandle *leftArg = type->types.head;

			bool match = true;

			for(unsigned i = 0; i < setTypes.size(); i++)
			{
				if(!leftArg || leftArg->type != setTypes[i])
				{
					match = false;
					break;
				}

				leftArg = leftArg->next;
			}

			if(!match)
				continue;

			if(leftArg)
				continue;

			return type;
		}
	}

	IntrusiveList<TypeHandle> setTypeList;

	for(unsigned i = 0; i < setTypes.size(); i++)
		setTypeList.push_back(new (get<TypeHandle>()) TypeHandle(setTypes[i]));

	// Create new type
	TypeFunctionSet* result = new (get<TypeFunctionSet>()) TypeFunctionSet(GetFunctionSetTypeName(*this, setTypeList), setTypeList);

	functionSetTypes.push_back(result);

	// This type is not added to export list

	return result;
}